

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O1

void __thiscall bloaty::ObjectFile::set_debug_file(ObjectFile *this,ObjectFile *file)

{
  int iVar1;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  (*this->debug_file_->_vptr_ObjectFile[2])(&local_50);
  (*this->_vptr_ObjectFile[2])(&local_30,this);
  if (local_48 == local_28) {
    if (local_48 != 0) {
      iVar1 = bcmp(local_50,local_30,local_48);
      if (iVar1 != 0) goto LAB_00188c6a;
    }
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    this->debug_file_ = file;
    return;
  }
LAB_00188c6a:
  __assert_fail("debug_file_->GetBuildId() == GetBuildId()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.h",
                0x11a,"void bloaty::ObjectFile::set_debug_file(const ObjectFile *)");
}

Assistant:

void set_debug_file(const ObjectFile* file) {
    assert(debug_file_->GetBuildId() == GetBuildId());
    debug_file_ = file;
  }